

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O3

void __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  char *pcVar1;
  Stack<rapidjson::CrtAllocator> *pSVar2;
  undefined1 uVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  if (pcVar1 == (this->
                super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                ).level_stack_.stack_) {
    (this->
    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).hasRoot_ = true;
    return;
  }
  if (pcVar1[-8] == '\x01') {
    uVar3 = type - kStringType < 0xfffffffe & (char)this->formatOptions_;
    pcVar1[-7] = uVar3;
    if (*(long *)(pcVar1 + -0x10) != 0) {
      pSVar2 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      pcVar4 = pSVar2->stackTop_;
      if (pSVar2->stackEnd_ == pcVar4 || (long)pSVar2->stackEnd_ - (long)pcVar4 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
        pcVar4 = pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = pcVar4 + 1;
      *pcVar4 = ',';
      uVar3 = pcVar1[-7];
      if (uVar3 == kFormatSingleLineArray) {
        pSVar2 = &((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_)->stack_;
        pcVar4 = pSVar2->stackTop_;
        if (pSVar2->stackEnd_ == pcVar4 || (long)pSVar2->stackEnd_ - (long)pcVar4 < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
          pcVar4 = pSVar2->stackTop_;
        }
        pSVar2->stackTop_ = pcVar4 + 1;
        *pcVar4 = ' ';
        uVar3 = pcVar1[-7];
      }
    }
    if ((uVar3 & kFormatSingleLineArray) != kFormatDefault) goto LAB_001524fd;
    pSVar2 = &((this->
               super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               ).os_)->stack_;
    pcVar4 = pSVar2->stackTop_;
    if (pSVar2->stackEnd_ == pcVar4 || (long)pSVar2->stackEnd_ - (long)pcVar4 < 0) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
      pcVar4 = pSVar2->stackTop_;
    }
    pSVar2->stackTop_ = pcVar4 + 1;
    *pcVar4 = '\n';
  }
  else {
    if (*(ulong *)(pcVar1 + -0x10) == 0) {
LAB_00152498:
      pSVar2 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      pcVar4 = pSVar2->stackTop_;
      if (pSVar2->stackEnd_ == pcVar4 || (long)pSVar2->stackEnd_ - (long)pcVar4 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
        pcVar4 = pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = pcVar4 + 1;
      *pcVar4 = '\n';
    }
    else {
      pSVar2 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      pcVar4 = pSVar2->stackTop_;
      lVar5 = (long)pSVar2->stackEnd_ - (long)pcVar4;
      if ((*(ulong *)(pcVar1 + -0x10) & 1) == 0) {
        if (lVar5 < 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
          pcVar4 = pSVar2->stackTop_;
        }
        pSVar2->stackTop_ = pcVar4 + 1;
        *pcVar4 = ',';
        goto LAB_00152498;
      }
      if (pSVar2->stackEnd_ == pcVar4 || lVar5 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
        pcVar4 = pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = pcVar4 + 1;
      *pcVar4 = ':';
      pSVar2 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      pcVar4 = pSVar2->stackTop_;
      if (pSVar2->stackEnd_ == pcVar4 || (long)pSVar2->stackEnd_ - (long)pcVar4 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar2,1);
        pcVar4 = pSVar2->stackTop_;
      }
      pSVar2->stackTop_ = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    if ((pcVar1[-0x10] & 1U) != 0) goto LAB_001524fd;
  }
  WriteIndent(this);
LAB_001524fd:
  *(long *)(pcVar1 + -0x10) = *(long *)(pcVar1 + -0x10) + 1;
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                level->inLine = (formatOptions_ & kFormatSingleLineArray) && type != kObjectType && type != kArrayType;

                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (level->inLine) {
                        Base::os_->Put(' ');
                    }
                }

                if (!level->inLine) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }